

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O3

shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_simple_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload)

{
  undefined8 uVar1;
  MiniBusClient *pMVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t sVar6;
  long lVar7;
  ulong in_R9;
  char *pcVar8;
  bool bVar9;
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar10;
  uint32_t rid;
  MiniBusEncoder encoder;
  unique_lock<std::mutex> lock;
  result_type local_e4;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  MiniBusClient *local_c0;
  ulong local_b8;
  size_t local_b0;
  int local_a8;
  uint uStack_a4;
  error_category *local_a0;
  unique_lock<std::mutex> local_98;
  undefined1 local_88 [16];
  error_code local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_40 [16];
  
  local_b0 = payload._M_len;
  sVar6 = command._M_len;
  local_98._M_device = (mutex_type *)(sVar6 + 0x13a8);
  local_98._M_owns = false;
  local_c0 = this;
  local_b8 = in_R9;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  while( true ) {
    local_e4 = std::uniform_int_distribution<unsigned_int>::operator()
                         ((uniform_int_distribution<unsigned_int> *)(sVar6 + 0x13a0),
                          (random_device *)(sVar6 + 0x18),(param_type *)(sVar6 + 0x13a0));
    lVar5 = *(long *)(sVar6 + 0x13e0);
    if (lVar5 == 0) break;
    uVar4 = (ulong)local_e4;
    lVar7 = sVar6 + 0x13d8;
    do {
      bVar9 = *(ulong *)(lVar5 + 0x20) < uVar4;
      if (!bVar9) {
        lVar7 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)bVar9 * 8);
    } while (lVar5 != 0);
    if ((lVar7 == sVar6 + 0x13d8) || (uVar4 < *(ulong *)(lVar7 + 0x20))) break;
  }
  local_d8 = (undefined1 *)0x0;
  local_d0 = 0;
  local_88._0_4_ = local_e4;
  local_e0 = &local_d0;
  std::__cxx11::string::append((char *)&local_e0,(ulong)local_88);
  std::__cxx11::string::push_back((char)&local_e0);
  std::__cxx11::string::append((char *)&local_e0,local_b0);
  std::__cxx11::string::reserve((ulong)&local_e0);
  if ((char *)0x7f < payload._M_str) {
    pcVar8 = payload._M_str;
    do {
      std::__cxx11::string::push_back((char)&local_e0);
      bVar9 = (char *)0x3fff < pcVar8;
      pcVar8 = (char *)((ulong)pcVar8 >> 7);
    } while (bVar9);
  }
  std::__cxx11::string::push_back((char)&local_e0);
  std::__cxx11::string::append((char *)&local_e0,local_b8);
  local_40._0_8_ = local_d8;
  if (local_d8 != (undefined1 *)0x0) {
    local_40._0_8_ = local_e0;
  }
  local_88._0_8_ = local_40;
  local_40._8_8_ = local_d8;
  local_a8 = 0;
  uStack_a4 = uStack_a4 & 0xffffff00;
  local_a0 = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_all_t>
            (sVar6 + 0x1460);
  local_78.cat_ = local_a0;
  if ((char)uStack_a4 != '\x01') {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa8);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011b608;
    p_Var3[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[4]._M_use_count = 0;
    p_Var3[4]._M_weak_count = 0;
    p_Var3[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[5]._M_use_count = 0;
    p_Var3[5]._M_weak_count = 0;
    p_Var3[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[6]._M_use_count = 0;
    p_Var3[6]._M_weak_count = 0;
    p_Var3[7]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[7]._M_use_count = 0;
    p_Var3[7]._M_weak_count = 0;
    p_Var3[8]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[8]._M_use_count = 0;
    p_Var3[8]._M_weak_count = 0;
    p_Var3[9]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[9]._M_use_count = 0;
    p_Var3[9]._M_weak_count = 0;
    p_Var3[10]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__NotifyToken_0011b658;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[2]._M_use_count = 0;
    p_Var3[2]._M_weak_count = 0;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[3]._M_use_count = 0;
    p_Var3[3]._M_weak_count = 0;
    std::condition_variable::condition_variable((condition_variable *)(p_Var3 + 4));
    *(undefined1 *)&p_Var3[9]._M_use_count = 0;
    p_Var3[10]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_88._0_8_ = (element_type *)(p_Var3 + 1);
    local_88._8_8_ = p_Var3;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
    ::
    _M_emplace_unique<unsigned_int&,std::shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>&>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
                *)(sVar6 + 0x13d0),&local_e4,
               (shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_88);
    pMVar2 = local_c0;
    *(undefined8 *)local_c0 = local_88._0_8_;
    (local_c0->info).super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_88._8_8_;
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_98);
    sVar10.
    super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    sVar10.
    super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)pMVar2;
    return (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )sVar10.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  uVar1._4_4_ = uStack_a4;
  uVar1._0_4_ = local_a8;
  std::runtime_error::runtime_error((runtime_error *)local_88,"write");
  local_68._M_p = (pointer)&local_58;
  local_88._0_8_ = &PTR__system_error_0011ad30;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_78._0_8_ = uVar1;
  boost::throw_exception<boost::system::system_error>((system_error *)local_88);
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<std::optional<std::string>>>
  send_simple(std::string_view command, std::string_view payload = {}) {
    std::unique_lock lock{mtx};
    auto rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<NotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }